

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

void * clib_loadlib(lua_State *L,char *name,int global)

{
  char *pcVar1;
  void *pvVar2;
  char *pcVar3;
  int in_EDX;
  uint uVar4;
  size_t in_RSI;
  char *in_RDI;
  char *err;
  char *e;
  void *h;
  char *in_stack_000000c8;
  lua_State *in_stack_000000d0;
  char *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *in_stack_fffffffffffffff8;
  
  pcVar1 = clib_extname(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar4 = 0;
  if (in_EDX != 0) {
    uVar4 = 0x100;
  }
  pvVar2 = (void *)dlopen(pcVar1,uVar4 | 1);
  if (pvVar2 != (void *)0x0) {
    return pvVar2;
  }
  pcVar1 = (char *)dlerror();
  if ((*pcVar1 == '/') &&
     (in_stack_ffffffffffffffd0 = (lua_State *)strchr(pcVar1,0x3a),
     in_stack_ffffffffffffffd0 != (lua_State *)0x0)) {
    lj_str_new(in_stack_fffffffffffffff8,in_RDI,in_RSI);
    pcVar3 = clib_resolve_lds(in_stack_000000d0,in_stack_000000c8);
    if (pcVar3 != (char *)0x0) {
      uVar4 = 0;
      if (in_EDX != 0) {
        uVar4 = 0x100;
      }
      pvVar2 = (void *)dlopen(pcVar3,uVar4 | 1);
      if (pvVar2 != (void *)0x0) {
        return pvVar2;
      }
      pcVar1 = (char *)dlerror();
    }
  }
  lj_err_callermsg(in_stack_ffffffffffffffd0,pcVar1);
}

Assistant:

static void *clib_loadlib(lua_State *L, const char *name, int global)
{
  void *h = dlopen(clib_extname(L, name),
		   RTLD_LAZY | (global?RTLD_GLOBAL:RTLD_LOCAL));
  if (!h) {
    const char *e, *err = dlerror();
    if (*err == '/' && (e = strchr(err, ':')) &&
	(name = clib_resolve_lds(L, strdata(lj_str_new(L, err, e-err))))) {
      h = dlopen(name, RTLD_LAZY | (global?RTLD_GLOBAL:RTLD_LOCAL));
      if (h) return h;
      err = dlerror();
    }
    lj_err_callermsg(L, err);
  }
  return h;
}